

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O3

void __thiscall wasm::ReferenceFinder::visitStructGet(ReferenceFinder *this,StructGet *curr)

{
  bool bVar1;
  HeapType HVar2;
  StructField structField;
  
  if ((curr->ref->type).id != 1) {
    bVar1 = wasm::Type::isNull(&curr->ref->type);
    if (!bVar1) {
      HVar2 = wasm::Type::getHeapType(&curr->ref->type);
      structField.second = curr->index;
      structField.first.id = HVar2.id;
      structField._12_4_ = 0;
      note(this,structField);
      return;
    }
  }
  return;
}

Assistant:

void visitStructGet(StructGet* curr) {
    if (curr->ref->type == Type::unreachable || curr->ref->type.isNull()) {
      return;
    }
    auto type = curr->ref->type.getHeapType();
    note(StructField{type, curr->index});
  }